

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::csharp::GetEnumValueName
                   (string *__return_storage_ptr__,string *enum_name,string *enum_value_name)

{
  string *input;
  undefined1 local_58 [8];
  string stripped;
  
  TryRemovePrefix((string *)local_58,enum_name,enum_value_name);
  ShoutyToPascalCase(__return_storage_ptr__,(csharp *)local_58,input);
  if ((byte)(*(__return_storage_ptr__->_M_dataplus)._M_p - 0x30U) < 10) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&stripped.field_2 + 8),"_",__return_storage_ptr__);
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(stripped.field_2._M_local_buf + 8));
    if ((undefined1 *)stripped.field_2._8_8_ != &stack0xffffffffffffffd8) {
      operator_delete((void *)stripped.field_2._8_8_);
    }
  }
  if (local_58 != (undefined1  [8])&stripped._M_string_length) {
    operator_delete((void *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumValueName(const std::string& enum_name, const std::string& enum_value_name) {
  std::string stripped = TryRemovePrefix(enum_name, enum_value_name);
  std::string result = ShoutyToPascalCase(stripped);
  // Just in case we have an enum name of FOO and a value of FOO_2... make sure the returned
  // string is a valid identifier.
  if (ascii_isdigit(result[0])) {
    result = "_" + result;
  }
  return result;
}